

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O3

int singlematch(int c,char *p,char *ep)

{
  byte bVar1;
  int iVar2;
  
  bVar1 = *p;
  if (bVar1 == 0x5b) {
    iVar2 = matchbracketclass(c,p,ep + -1);
    return iVar2;
  }
  if (bVar1 != 0x2e) {
    if (bVar1 == 0x25) {
      iVar2 = match_class(c,(uint)(byte)p[1]);
      return iVar2;
    }
    return (int)((uint)bVar1 == c);
  }
  return 1;
}

Assistant:

static int singlematch(int c, const char *p, const char *ep)
{
  switch (*p) {
  case '.': return 1;  /* matches any char */
  case L_ESC: return match_class(c, uchar(*(p+1)));
  case '[': return matchbracketclass(c, p, ep-1);
  default:  return (uchar(*p) == c);
  }
}